

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O1

void __thiscall
Assimp::FindInvalidDataProcess::ProcessAnimationChannel
          (FindInvalidDataProcess *this,aiNodeAnim *anim)

{
  float *pfVar1;
  aiQuaternion *paVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  undefined8 uVar6;
  double dVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  bool bVar11;
  ulong uVar12;
  float *pfVar13;
  aiQuatKey *paVar14;
  aiVectorKey *paVar15;
  Logger *this_00;
  aiQuatKey *n;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  aiVectorKey v;
  float local_48;
  
  if (anim == (aiNodeAnim *)0x0) {
    __assert_fail("nullptr != anim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/FindInvalidDataProcess.cpp"
                  ,0x11d,
                  "void Assimp::FindInvalidDataProcess::ProcessAnimationChannel(aiNodeAnim *)");
  }
  uVar5 = anim->mNumPositionKeys;
  if (((uVar5 == 0) && (anim->mNumRotationKeys == 0)) && (anim->mNumScalingKeys == 0)) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/FindInvalidDataProcess.cpp"
                  ,0x11f,
                  "void Assimp::FindInvalidDataProcess::ProcessAnimationChannel(aiNodeAnim *)");
  }
  if (1 < uVar5) {
    paVar15 = anim->mPositionKeys;
    fVar3 = this->configEpsilon;
    uVar12 = (ulong)(uVar5 - 1);
    pfVar13 = &paVar15[1].mValue.z;
    uVar16 = 0;
    if (fVar3 == 0.0) {
      while( true ) {
        uVar18 = uVar16;
        if (uVar12 == uVar18) goto LAB_00152b75;
        if (((((aiVector3D *)(pfVar13 + -2))->x != pfVar13[-8]) ||
            (NAN(((aiVector3D *)(pfVar13 + -2))->x) || NAN(pfVar13[-8]))) ||
           ((pfVar13[-1] != pfVar13[-7] || (NAN(pfVar13[-1]) || NAN(pfVar13[-7]))))) break;
        fVar3 = *pfVar13;
        pfVar1 = pfVar13 + -6;
        pfVar13 = pfVar13 + 6;
        if ((fVar3 != *pfVar1) || (uVar16 = uVar18 + 1, NAN(fVar3) || NAN(*pfVar1))) break;
      }
    }
    else {
      do {
        uVar18 = uVar16;
        if (uVar12 == uVar18) goto LAB_00152b75;
        if ((ABS(pfVar13[-8] - ((aiVector3D *)(pfVar13 + -2))->x) <= fVar3) ||
           (ABS(pfVar13[-7] - pfVar13[-1]) <= fVar3)) break;
        pfVar1 = pfVar13 + -6;
        fVar4 = *pfVar13;
        pfVar13 = pfVar13 + 6;
        uVar16 = uVar18 + 1;
      } while (fVar3 < ABS(*pfVar1 - fVar4));
    }
    if (uVar12 <= uVar18) {
LAB_00152b75:
      uVar6 = *(undefined8 *)&(paVar15->mValue).z;
      dVar7 = paVar15->mTime;
      fVar3 = (paVar15->mValue).x;
      fVar4 = (paVar15->mValue).y;
      if (paVar15 != (aiVectorKey *)0x0) {
        operator_delete__(paVar15);
      }
      anim->mNumPositionKeys = 1;
      paVar15 = (aiVectorKey *)operator_new__(0x18);
      paVar15->mTime = 0.0;
      (paVar15->mValue).x = 0.0;
      (paVar15->mValue).y = 0.0;
      (paVar15->mValue).z = 0.0;
      anim->mPositionKeys = paVar15;
      local_48 = (float)uVar6;
      (paVar15->mValue).z = local_48;
      paVar15->mTime = dVar7;
      (paVar15->mValue).x = fVar3;
      (paVar15->mValue).y = fVar4;
      bVar8 = true;
      goto LAB_00152bca;
    }
  }
  bVar8 = false;
LAB_00152bca:
  if (1 < anim->mNumRotationKeys) {
    paVar14 = anim->mRotationKeys;
    fVar3 = this->configEpsilon;
    uVar16 = (ulong)(anim->mNumRotationKeys - 1);
    if (fVar3 == 0.0) {
      pfVar13 = &paVar14[1].mValue.z;
      uVar12 = 0;
      while( true ) {
        uVar18 = uVar12;
        if (uVar16 == uVar18) goto LAB_00152c88;
        if (((((pfVar13[-2] != pfVar13[-8]) || (NAN(pfVar13[-2]) || NAN(pfVar13[-8]))) ||
             (pfVar13[-1] != pfVar13[-7])) ||
            ((NAN(pfVar13[-1]) || NAN(pfVar13[-7]) || (*pfVar13 != pfVar13[-6])))) ||
           (NAN(*pfVar13) || NAN(pfVar13[-6]))) break;
        paVar2 = (aiQuaternion *)(pfVar13 + -3);
        pfVar1 = pfVar13 + -9;
        pfVar13 = pfVar13 + 6;
        if ((paVar2->w != *pfVar1) || (uVar12 = uVar18 + 1, NAN(paVar2->w) || NAN(*pfVar1))) break;
      }
    }
    else {
      lVar17 = 1;
      n = paVar14;
      do {
        if (lVar17 + uVar16 == 1) goto LAB_00152c88;
        bVar11 = EpsilonCompare<aiQuatKey>(n,n + 1,fVar3);
        lVar17 = lVar17 + -1;
        n = n + 1;
      } while (bVar11);
      uVar18 = -lVar17;
    }
    if (uVar16 <= uVar18) {
LAB_00152c88:
      fVar3 = (paVar14->mValue).y;
      fVar4 = (paVar14->mValue).z;
      dVar7 = paVar14->mTime;
      fVar9 = (paVar14->mValue).w;
      fVar10 = (paVar14->mValue).x;
      if (paVar14 != (aiQuatKey *)0x0) {
        operator_delete__(paVar14);
      }
      anim->mNumRotationKeys = 1;
      paVar14 = (aiQuatKey *)operator_new__(0x18);
      paVar14->mTime = 0.0;
      (paVar14->mValue).w = 1.0;
      (paVar14->mValue).x = 0.0;
      (paVar14->mValue).y = 0.0;
      (paVar14->mValue).z = 0.0;
      anim->mRotationKeys = paVar14;
      (paVar14->mValue).y = fVar3;
      (paVar14->mValue).z = fVar4;
      paVar14->mTime = dVar7;
      (paVar14->mValue).w = fVar9;
      (paVar14->mValue).x = fVar10;
      bVar8 = true;
    }
  }
  if (1 < anim->mNumScalingKeys) {
    paVar15 = anim->mScalingKeys;
    fVar3 = this->configEpsilon;
    uVar12 = (ulong)(anim->mNumScalingKeys - 1);
    pfVar13 = &paVar15[1].mValue.z;
    uVar16 = 0;
    if (fVar3 == 0.0) {
      while( true ) {
        uVar18 = uVar16;
        if (uVar12 == uVar18) goto LAB_00152dad;
        if ((((((aiVector3D *)(pfVar13 + -2))->x != pfVar13[-8]) ||
             (NAN(((aiVector3D *)(pfVar13 + -2))->x) || NAN(pfVar13[-8]))) ||
            (pfVar13[-1] != pfVar13[-7])) || (NAN(pfVar13[-1]) || NAN(pfVar13[-7]))) break;
        fVar3 = *pfVar13;
        pfVar1 = pfVar13 + -6;
        pfVar13 = pfVar13 + 6;
        if ((fVar3 != *pfVar1) || (uVar16 = uVar18 + 1, NAN(fVar3) || NAN(*pfVar1))) break;
      }
    }
    else {
      do {
        uVar18 = uVar16;
        if (uVar12 == uVar18) goto LAB_00152dad;
        if ((ABS(pfVar13[-8] - ((aiVector3D *)(pfVar13 + -2))->x) <= fVar3) ||
           (ABS(pfVar13[-7] - pfVar13[-1]) <= fVar3)) break;
        pfVar1 = pfVar13 + -6;
        fVar4 = *pfVar13;
        pfVar13 = pfVar13 + 6;
        uVar16 = uVar18 + 1;
      } while (fVar3 < ABS(*pfVar1 - fVar4));
    }
    if (uVar12 <= uVar18) {
LAB_00152dad:
      uVar6 = *(undefined8 *)&(paVar15->mValue).z;
      dVar7 = paVar15->mTime;
      fVar3 = (paVar15->mValue).x;
      fVar4 = (paVar15->mValue).y;
      if (paVar15 != (aiVectorKey *)0x0) {
        operator_delete__(paVar15);
      }
      anim->mNumScalingKeys = 1;
      paVar15 = (aiVectorKey *)operator_new__(0x18);
      paVar15->mTime = 0.0;
      (paVar15->mValue).x = 0.0;
      (paVar15->mValue).y = 0.0;
      (paVar15->mValue).z = 0.0;
      anim->mScalingKeys = paVar15;
      local_48 = (float)uVar6;
      (paVar15->mValue).z = local_48;
      paVar15->mTime = dVar7;
      (paVar15->mValue).x = fVar3;
      (paVar15->mValue).y = fVar4;
      bVar8 = true;
    }
  }
  if (!bVar8) {
    return;
  }
  this_00 = DefaultLogger::get();
  Logger::warn(this_00,"Simplified dummy tracks with just one key");
  return;
}

Assistant:

void FindInvalidDataProcess::ProcessAnimationChannel (aiNodeAnim* anim) {
    ai_assert( nullptr != anim );
    if (anim->mNumPositionKeys == 0 && anim->mNumRotationKeys == 0 && anim->mNumScalingKeys == 0) {
        ai_assert_entry();
        return;
    }

    // Check whether all values in a tracks are identical - in this case
    // we can remove al keys except one.
    // POSITIONS
    int i = 0;
    if (anim->mNumPositionKeys > 1 && AllIdentical(anim->mPositionKeys,anim->mNumPositionKeys,configEpsilon)) {
        aiVectorKey v = anim->mPositionKeys[0];

        // Reallocate ... we need just ONE element, it makes no sense to reuse the array
        delete[] anim->mPositionKeys;
        anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys = 1];
        anim->mPositionKeys[0] = v;
        i = 1;
    }

    // ROTATIONS
    if (anim->mNumRotationKeys > 1 && AllIdentical(anim->mRotationKeys,anim->mNumRotationKeys,configEpsilon)) {
        aiQuatKey v = anim->mRotationKeys[0];

        // Reallocate ... we need just ONE element, it makes no sense to reuse the array
        delete[] anim->mRotationKeys;
        anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys = 1];
        anim->mRotationKeys[0] = v;
        i = 1;
    }

    // SCALINGS
    if (anim->mNumScalingKeys > 1 && AllIdentical(anim->mScalingKeys,anim->mNumScalingKeys,configEpsilon)) {
        aiVectorKey v = anim->mScalingKeys[0];

        // Reallocate ... we need just ONE element, it makes no sense to reuse the array
        delete[] anim->mScalingKeys;
        anim->mScalingKeys = new aiVectorKey[anim->mNumScalingKeys = 1];
        anim->mScalingKeys[0] = v;
        i = 1;
    }
    if ( 1 == i ) {
        ASSIMP_LOG_WARN("Simplified dummy tracks with just one key");
    }
}